

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslGrammar.cpp
# Opt level: O2

bool __thiscall
glslang::HlslGrammar::acceptMemberFunctionDefinition
          (HlslGrammar *this,TIntermNode **nodeList,TType *type,TString *memberName,
          TFunctionDeclarator *declarator)

{
  undefined4 uVar1;
  int iVar2;
  bool bVar3;
  int iVar4;
  TFunction *this_00;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  TQualifier *qualifier;
  TVector<glslang::HlslToken> *this_01;
  TString **s;
  size_t s_00;
  TString *functionName;
  
  s = &functionName;
  functionName = memberName;
  HlslParseContext::getFullNamespaceName(this->parseContext,&functionName);
  this_00 = (TFunction *)TSymbol::operator_new((TSymbol *)0x160,(size_t)s);
  TFunction::TFunction(this_00,functionName,type,EOpNull);
  declarator->function = this_00;
  iVar4 = (*type->_vptr_TType[0xb])(type);
  (*(declarator->function->super_TSymbol)._vptr_TSymbol
    [(ulong)((*(byte *)(CONCAT44(extraout_var,iVar4) + 8) & 0x7f) != 0) * 2 + 0x20])();
  bVar3 = acceptFunctionParameters(this,declarator->function);
  if (bVar3) {
    iVar4 = (*(declarator->function->super_TSymbol)._vptr_TSymbol[0xd])();
    qualifier = (TQualifier *)
                (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar4) + 0x50))
                          ((long *)CONCAT44(extraout_var_00,iVar4));
    acceptPostDecls(this,qualifier);
    s_00 = 0x167;
    bVar3 = HlslTokenStream::peekTokenClass(&this->super_HlslTokenStream,EHTokLeftBrace);
    if (bVar3) {
      uVar1 = *(undefined4 *)&(this->super_HlslTokenStream).token.loc.field_0x14;
      (declarator->loc).column = (this->super_HlslTokenStream).token.loc.column;
      *(undefined4 *)&(declarator->loc).field_0x14 = uVar1;
      iVar4 = (this->super_HlslTokenStream).token.loc.string;
      iVar2 = (this->super_HlslTokenStream).token.loc.line;
      (declarator->loc).name = (this->super_HlslTokenStream).token.loc.name;
      (declarator->loc).string = iVar4;
      (declarator->loc).line = iVar2;
      this_01 = (TVector<glslang::HlslToken> *)
                TVector<glslang::HlslToken>::operator_new((TVector<glslang::HlslToken> *)0x20,s_00);
      TVector<glslang::HlslToken>::TVector(this_01);
      declarator->body = this_01;
      bVar3 = acceptFunctionDefinition(this,declarator,nodeList,this_01);
      return bVar3;
    }
  }
  else {
    expected(this,"function parameter list");
  }
  return false;
}

Assistant:

bool HlslGrammar::acceptMemberFunctionDefinition(TIntermNode*& nodeList, const TType& type, TString& memberName,
                                                 TFunctionDeclarator& declarator)
{
    bool accepted = false;

    TString* functionName = &memberName;
    parseContext.getFullNamespaceName(functionName);
    declarator.function = new TFunction(functionName, type);
    if (type.getQualifier().storage == EvqTemporary)
        declarator.function->setImplicitThis();
    else
        declarator.function->setIllegalImplicitThis();

    // function_parameters
    if (acceptFunctionParameters(*declarator.function)) {
        // post_decls
        acceptPostDecls(declarator.function->getWritableType().getQualifier());

        // compound_statement (function body definition)
        if (peekTokenClass(EHTokLeftBrace)) {
            declarator.loc = token.loc;
            declarator.body = new TVector<HlslToken>;
            accepted = acceptFunctionDefinition(declarator, nodeList, declarator.body);
        }
    } else
        expected("function parameter list");

    return accepted;
}